

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FirewirePort.cpp
# Opt level: O2

void __thiscall FirewirePort::PollEvents(FirewirePort *this)

{
  uint __i;
  int iVar1;
  long lVar2;
  timeval timeout;
  fd_set fds;
  
  timeout.tv_sec = 0;
  timeout.tv_usec = 0;
  iVar1 = raw1394_get_fd(this->handle);
  for (lVar2 = 0; lVar2 != 0x10; lVar2 = lVar2 + 1) {
    fds.fds_bits[lVar2] = 0;
  }
  fds.fds_bits[iVar1 / 0x40] = fds.fds_bits[iVar1 / 0x40] | 1L << ((byte)iVar1 & 0x3f);
  iVar1 = select(iVar1 + 1,(fd_set *)&fds,(fd_set *)0x0,(fd_set *)0x0,(timeval *)&timeout);
  if (0 < iVar1) {
    raw1394_loop_iterate(this->handle);
  }
  return;
}

Assistant:

void FirewirePort::PollEvents(void)
{
    fd_set fds;
    struct timeval timeout = {0, 0};

    int fd = raw1394_get_fd(handle);
    FD_ZERO(&fds);
    FD_SET(fd, &fds);
    int ret = select(fd+1, &fds, 0, 0, &timeout);
    if (ret > 0)
        raw1394_loop_iterate(handle);
}